

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O3

void ssh_send(Backend *be,char *buf,size_t len)

{
  if (be[-3].vt != (BackendVtable *)0x0) {
    bufchain_add((bufchain *)(be + 0x11),buf,len);
    if (be[0x19].interactor != (Interactor *)0x0) {
      (*(code *)(be[0x19].interactor)->parent[8].vt)();
      return;
    }
  }
  return;
}

Assistant:

static void ssh_send(Backend *be, const char *buf, size_t len)
{
    Ssh *ssh = container_of(be, Ssh, backend);

    if (ssh == NULL || ssh->s == NULL)
        return;

    bufchain_add(&ssh->user_input, buf, len);
    if (ssh->cl)
        ssh_got_user_input(ssh->cl);
}